

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O0

void lws_buflist_describe(lws_buflist **head,void *id,char *reason)

{
  long lVar1;
  uint local_2c;
  int n;
  lws_buflist *old;
  char *reason_local;
  void *id_local;
  lws_buflist **head_local;
  
  local_2c = 0;
  id_local = head;
  if (*head == (lws_buflist *)0x0) {
    _lws_log(4,"%p: %s: buflist empty\n",id,reason);
  }
  while( true ) {
    if (*id_local == 0) {
      return;
    }
    _lws_log(4,"%p: %s: %d: %llu / %llu (%llu left)\n",id,reason,(ulong)local_2c,
             *(undefined8 *)(*id_local + 0x10),*(undefined8 *)(*id_local + 8),
             *(long *)(*id_local + 8) - *(long *)(*id_local + 0x10));
    lVar1 = *id_local;
    id_local = *id_local;
    if (*id_local == lVar1) break;
    local_2c = local_2c + 1;
  }
  _lws_log(1,"%s: next points to self\n","lws_buflist_describe");
  return;
}

Assistant:

void
lws_buflist_describe(struct lws_buflist **head, void *id, const char *reason)
{
	struct lws_buflist *old;
	int n = 0;

	if (*head == NULL)
		lwsl_notice("%p: %s: buflist empty\n", id, reason);

	while (*head) {
		lwsl_notice("%p: %s: %d: %llu / %llu (%llu left)\n", id,
			    reason, n,
			    (unsigned long long)(*head)->pos,
			    (unsigned long long)(*head)->len,
			    (unsigned long long)(*head)->len - (*head)->pos);
		old = *head;
		head = &((*head)->next);
		if (*head == old) {
			lwsl_err("%s: next points to self\n", __func__);
			break;
		}
		n++;
	}
}